

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  bool was_packed_on_wire;
  int number;
  ExtensionInfo extension;
  bool local_45;
  int local_44;
  ExtensionInfo local_40;
  
  bVar1 = FindExtensionInfoFromTag(this,tag,extension_finder,&local_44,&local_40,&local_45);
  if (bVar1) {
    uVar2 = ParseFieldWithExtensionInfo(this,local_44,local_45,&local_40,input,field_skipper);
  }
  else {
    iVar3 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,tag);
    uVar2 = (undefined1)iVar3;
  }
  return (bool)uVar2;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              ExtensionFinder* extension_finder,
                              FieldSkipper* field_skipper) {
  int number;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromTag(tag, extension_finder, &number, &extension,
                                &was_packed_on_wire)) {
    return field_skipper->SkipField(input, tag);
  } else {
    return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                       input, field_skipper);
  }
}